

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_string.hpp
# Opt level: O0

bool __thiscall
chaiscript::utility::Static_String::operator==(Static_String *this,string_view other)

{
  char *pcVar1;
  const_iterator pvVar2;
  const_iterator e2;
  const_iterator b2;
  char *e1;
  char *b1;
  Static_String *this_local;
  string_view other_local;
  
  other_local._M_len = (size_t)other._M_str;
  this_local = (Static_String *)other._M_len;
  e1 = begin(this);
  pcVar1 = end(this);
  e2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                 ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if ((long)pcVar1 - (long)e1 == (long)pvVar2 - (long)e2) {
    for (; e1 != pcVar1; e1 = e1 + 1) {
      if (*e1 != *e2) {
        return false;
      }
      e2 = e2 + 1;
    }
    other_local._M_str._7_1_ = true;
  }
  else {
    other_local._M_str._7_1_ = false;
  }
  return other_local._M_str._7_1_;
}

Assistant:

constexpr bool operator==(std::string_view other) const noexcept {
      // return std::string_view(data, m_size) == other;
      auto b1 = begin();
      const auto e1 = end();
      auto b2 = other.begin();
      const auto e2 = other.end();

      if (e1 - b1 != e2 - b2) {
        return false;
      }

      while (b1 != e1) {
        if (*b1 != *b2) {
          return false;
        }
        ++b1;
        ++b2;
      }
      return true;
    }